

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O2

int __thiscall MovDemuxer::mov_read_stss(MovDemuxer *this,MOVAtom atom)

{
  Track *pTVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  uint local_2c;
  
  pTVar1 = (this->super_IOContextDemuxer).tracks
           [(long)(this->super_IOContextDemuxer).num_tracks + -1];
  IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
  IOContextDemuxer::get_be24(&this->super_IOContextDemuxer);
  uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  iVar3 = 0;
  if (*(int *)((long)&pTVar1[1].encodingAlgoPriv.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 8) == 0) {
    if (uVar2 < 0x3fffffff) {
      uVar4 = (ulong)uVar2;
      while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, iVar3 = 0, bVar5) {
        local_2c = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pTVar1[2].language,
                   &local_2c);
      }
    }
    else {
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int MovDemuxer::mov_read_stss(MOVAtom atom)
{
    const auto st = reinterpret_cast<MOVStreamContext*>(tracks[num_tracks - 1]);
    get_byte();  // version
    get_be24();  // flags

    const unsigned int entries = get_be32();
    if (st->sample_size)
        return 0;
    if (entries >= UINT_MAX / sizeof(int))
        return -1;
    for (size_t i = 0; i < entries; i++) st->keyframes.push_back(get_be32());
    return 0;
}